

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags,ImGuiWindow *outer_window)

{
  uint uVar1;
  bool bVar2;
  ImGuiWindow *window_for_settings;
  ImGuiWindow *outer_window_local;
  ImGuiTableFlags flags_local;
  
  outer_window_local._4_4_ = flags;
  if ((flags & 0xe000U) == 0) {
    bVar2 = true;
    if ((flags & 0x800000U) == 0) {
      bVar2 = (outer_window->Flags & 0x40U) != 0;
    }
    uVar1 = 0x8000;
    if (bVar2) {
      uVar1 = 0x2000;
    }
    outer_window_local._4_4_ = uVar1 | flags;
  }
  if ((outer_window_local._4_4_ & 0xe000) == 0x4000) {
    outer_window_local._4_4_ = outer_window_local._4_4_ | 0x20000;
  }
  if ((outer_window_local._4_4_ & 1) != 0) {
    outer_window_local._4_4_ = outer_window_local._4_4_ | 0x200;
  }
  if (((outer_window_local._4_4_ & 0x10000) != 0) && ((outer_window_local._4_4_ & 0x1800000) != 0))
  {
    outer_window_local._4_4_ = outer_window_local._4_4_ & 0xfffeffff;
  }
  if ((outer_window_local._4_4_ & 0x1000) != 0) {
    outer_window_local._4_4_ = outer_window_local._4_4_ & 0xfffff7ff;
  }
  if ((outer_window_local._4_4_ & 0xf) == 0) {
    outer_window_local._4_4_ = outer_window_local._4_4_ | 0x10;
  }
  if ((outer_window->RootWindow->Flags & 0x100U) != 0) {
    outer_window_local._4_4_ = outer_window_local._4_4_ | 0x10;
  }
  return outer_window_local._4_4_;
}

Assistant:

inline ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags, ImGuiWindow* outer_window)
{
    // Adjust flags: set default sizing policy
    if ((flags & ImGuiTableFlags_SizingMask_) == 0)
        flags |= ((flags & ImGuiTableFlags_ScrollX) || (outer_window->Flags & ImGuiWindowFlags_AlwaysAutoResize)) ? ImGuiTableFlags_SizingFixedFit : ImGuiTableFlags_SizingStretchSame;

    // Adjust flags: enable NoKeepColumnsVisible when using ImGuiTableFlags_SizingFixedSame
    if ((flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
        flags |= ImGuiTableFlags_NoKeepColumnsVisible;

    // Adjust flags: enforce borders when resizable
    if (flags & ImGuiTableFlags_Resizable)
        flags |= ImGuiTableFlags_BordersInnerV;

    // Adjust flags: disable NoHostExtendY if we have any scrolling going on
    if ((flags & ImGuiTableFlags_NoHostExtendY) && (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0)
        flags &= ~ImGuiTableFlags_NoHostExtendY;

    // Adjust flags: NoBordersInBodyUntilResize takes priority over NoBordersInBody
    if (flags & ImGuiTableFlags_NoBordersInBodyUntilResize)
        flags &= ~ImGuiTableFlags_NoBordersInBody;

    // Adjust flags: disable saved settings if there's nothing to save
    if ((flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Hideable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Sortable)) == 0)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Inherit _NoSavedSettings from top-level window (child windows always have _NoSavedSettings set)
#ifdef IMGUI_HAS_DOCK
    ImGuiWindow* window_for_settings = outer_window->RootWindowDockStop;
#else
    ImGuiWindow* window_for_settings = outer_window->RootWindow;
#endif
    if (window_for_settings->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    return flags;
}